

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_joinref.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::CreatePlan(Binder *this,BoundJoinRef *ref)

{
  _Atomic_word *this_00;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_01;
  pointer *this_02;
  undefined1 uVar1;
  JoinType type;
  LogicalOperatorType LVar2;
  _Head_base<0UL,_duckdb::SampleOptions_*,_false> context;
  _func_int **pp_Var3;
  pointer puVar4;
  pointer puVar5;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  LogicalOperator *pLVar8;
  undefined8 uVar9;
  bool bVar10;
  int iVar11;
  type pLVar12;
  ClientConfig *pCVar13;
  pointer pEVar14;
  pointer pLVar15;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var16;
  LogicalFilter *pLVar17;
  reference pvVar18;
  reference pvVar19;
  type expression_00;
  element_type *this_03;
  pointer pLVar20;
  LogicalAnyJoin *pLVar21;
  NotImplementedException *this_04;
  JoinRefType reftype;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  pointer puVar22;
  size_type __n;
  undefined1 auVar23 [8];
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> condition;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *child;
  pointer this_05;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_06;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expression;
  optional_ptr<duckdb::LogicalOperator,_true> join;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *result;
  undefined1 local_e8 [8];
  undefined1 local_e0 [24];
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_c8;
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_a0;
  _Head_base<0UL,_duckdb::LogicalFilter_*,_false> local_98;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_90;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_88;
  __node_base local_80;
  long *local_78;
  _Prime_rehash_policy local_70;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_60;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_58;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_50;
  __node_base local_48;
  element_type *local_40;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_38;
  
  uVar1 = *(undefined1 *)
           ((long)&ref[3].correlated_columns.
                   super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                   .
                   super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
  if (*(char *)((long)&in_RDX[6]._M_use_count + 3) == '\x01') {
    *(undefined1 *)
     ((long)&ref[3].correlated_columns.
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             .
             super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) = 0;
  }
  local_e0._8_8_ = in_RDX;
  local_c8._M_head_impl = (LogicalOperator *)this;
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::operator*
            ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> *)
             &in_RDX[3]._M_use_count);
  CreatePlan((Binder *)(local_e0 + 0x10),&ref->super_BoundTableRef);
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::operator*
            ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> *)
             (in_RDX + 4));
  CreatePlan((Binder *)local_e0,&ref->super_BoundTableRef);
  *(undefined1 *)
   ((long)&ref[3].correlated_columns.
           super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           .
           super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) = uVar1;
  if ((*(char *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x60))->
                        _M_use_count + 3) == '\0') &&
     (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x70))->
      _vptr__Sp_counted_base !=
      *(_func_int ***)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x70))->_M_use_count)) {
    pLVar12 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)local_e0);
    LateralBinder::ReduceExpressionDepth
              (pLVar12,(vector<duckdb::CorrelatedColumnInfo,_true> *)(local_e0._8_8_ + 0x70));
  }
  if ((((*(char *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x60))
                          ->_M_use_count + 1) == '\x02') &&
       (*(char *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x60))->
                         _M_use_count + 2) != '\x04')) &&
      (pCVar13 = ClientConfig::GetConfig
                           ((ClientContext *)
                            (ref->super_BoundTableRef).sample.
                            super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
                            .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl),
      pCVar13->enable_optimizer == true)) &&
     (bVar10 = Optimizer::OptimizerDisabled
                         ((ClientContext *)
                          (ref->super_BoundTableRef).sample.
                          super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
                          .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl,
                          BUILD_SIDE_PROBE_SIDE), uVar9 = local_e0._16_8_, !bVar10)) {
    *(undefined1 *)
     ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x60))->_M_use_count
     + 1) = 1;
    local_e0._16_8_ = local_e0._0_8_;
    local_e0._0_8_ = uVar9;
  }
  if (*(char *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x60))->
                       _M_use_count + 3) == '\x01') {
    local_38._M_head_impl = (LogicalOperator *)local_e0._16_8_;
    local_e0._16_8_ = (ClientContext *)0x0;
    local_40 = (element_type *)local_e0._0_8_;
    local_e0._0_8_ =
         (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
          )0x0;
    condition.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._1_7_ = 0;
    condition.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_ =
         *(byte *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x60))
                          ->_M_use_count + 1);
    local_78 = *(long **)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x40))
                          ->_M_use_count;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x40))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x40))->_M_weak_count = 0;
    PlanLateralJoin((Binder *)local_c8._M_head_impl,
                    (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                     *)ref,(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)&local_38,(vector<duckdb::CorrelatedColumnInfo,_true> *)&local_40,
                    (char)local_e0._8_8_ + 0x70,condition);
    if (local_78 != (long *)0x0) {
      (**(code **)(*local_78 + 8))();
    }
    local_78 = (long *)0x0;
    if (local_40 != (element_type *)0x0) {
      (**(code **)((long)(local_40->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
                         internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + 8))();
    }
    local_40 = (element_type *)0x0;
    if ((element_type *)local_38._M_head_impl != (element_type *)0x0) {
      (**(code **)(*(long *)&((enable_shared_from_this<duckdb::Binder> *)
                             &(local_38._M_head_impl)->_vptr_LogicalOperator)->__weak_this_ + 8))();
    }
    local_38._M_head_impl = (LogicalOperator *)0x0;
    if (*(char *)&ref[3].correlated_columns.
                  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                  .
                  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start != '\x01') goto LAB_00712364;
    local_c0._0_8_ = &PTR__RecursiveDependentJoinPlanner_019a0438;
    local_c0._8_8_ = (LogicalOperator *)0x0;
    local_b0._M_allocated_capacity = (size_type)ref;
    pLVar12 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)local_c8._M_head_impl);
    RecursiveDependentJoinPlanner::VisitOperator((RecursiveDependentJoinPlanner *)local_c0,pLVar12);
    local_c0._0_8_ = &PTR__RecursiveDependentJoinPlanner_019a0438;
    auVar23 = (undefined1  [8])local_c0._8_8_;
LAB_00711da9:
    if (auVar23 != (undefined1  [8])0x0) {
      (*((LogicalOperator *)auVar23)->_vptr_LogicalOperator[1])();
    }
    goto LAB_00712364;
  }
  reftype = *(JoinRefType *)
             ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x60))->
                     _M_use_count + 2);
  if (reftype == POSITIONAL) {
    local_50._M_head_impl = (LogicalOperator *)local_e0._16_8_;
    local_e0._16_8_ = (ClientContext *)0x0;
    local_88._M_head_impl = (LogicalOperator *)local_e0._0_8_;
    local_e0._0_8_ =
         (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
          )0x0;
    LogicalPositionalJoin::Create
              ((LogicalPositionalJoin *)local_c8._M_head_impl,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_50,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_88);
    if ((element_type *)local_88._M_head_impl != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                   &(local_88._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_88._M_head_impl = (LogicalOperator *)0x0;
    if ((element_type *)local_50._M_head_impl != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                   &(local_50._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_50._M_head_impl = (LogicalOperator *)0x0;
    goto LAB_00712364;
  }
  if (reftype == CROSS) {
    local_48._M_nxt = (_Hash_node_base *)local_e0._16_8_;
    local_e0._16_8_ = (ClientContext *)0x0;
    local_80._M_nxt = (_Hash_node_base *)local_e0._0_8_;
    local_e0._0_8_ =
         (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
          )0x0;
    LogicalCrossProduct::Create
              ((LogicalCrossProduct *)local_c8._M_head_impl,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_48,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_80);
    if ((element_type *)local_80._M_nxt != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)&(local_80._M_nxt)->_M_nxt)->
                  __weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_80._M_nxt = (_Hash_node_base *)0x0;
    if ((element_type *)local_48._M_nxt != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)&(local_48._M_nxt)->_M_nxt)->
                  __weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_48._M_nxt = (_Hash_node_base *)0x0;
    goto LAB_00712364;
  }
  if (*(char *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x60))->
                       _M_use_count + 1) == '\x03') {
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x40);
    this_00 = &p_Var7->_M_use_count;
    pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)this_00);
    iVar11 = (*(pEVar14->super_BaseExpression)._vptr_BaseExpression[4])(pEVar14);
    if ((char)iVar11 == '\0') {
      expression_00 =
           unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)this_00);
      bVar10 = HasCorrelatedColumns(expression_00);
      reftype = *(JoinRefType *)
                 ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x60))->
                         _M_use_count + 2);
      if (bVar10 && reftype == REGULAR) goto LAB_00712177;
    }
    else {
      reftype = *(JoinRefType *)
                 ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x60))->
                         _M_use_count + 2);
      if (reftype == REGULAR) {
LAB_00712177:
        local_58._M_head_impl = (LogicalOperator *)local_e0._16_8_;
        local_e0._16_8_ = (ClientContext *)0x0;
        local_90._M_head_impl = (LogicalOperator *)local_e0._0_8_;
        local_e0._0_8_ =
             (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
              )0x0;
        LogicalCrossProduct::Create
                  ((LogicalCrossProduct *)local_e8,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_58,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_90);
        if ((element_type *)local_90._M_head_impl != (element_type *)0x0) {
          (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                       &(local_90._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
        local_90._M_head_impl = (LogicalOperator *)0x0;
        if ((element_type *)local_58._M_head_impl != (element_type *)0x0) {
          (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                       &(local_58._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
        local_58._M_head_impl = (LogicalOperator *)0x0;
        this_03 = (element_type *)operator_new(0x80);
        local_c0._0_8_ = *(undefined8 *)this_00;
        p_Var7->_M_use_count = 0;
        p_Var7->_M_weak_count = 0;
        LogicalFilter::LogicalFilter
                  ((LogicalFilter *)this_03,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_c0);
        local_98._M_head_impl = (LogicalFilter *)this_03;
        if ((_func_int **)local_c0._0_8_ != (_func_int **)0x0) {
          (**(code **)(*(_func_int **)local_c0._0_8_ + 8))();
        }
        pLVar20 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                                *)&local_98);
        puVar22 = (pLVar20->super_LogicalOperator).expressions.
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar5 = (pLVar20->super_LogicalOperator).expressions.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar22 != puVar5) {
          do {
            PlanSubqueries((Binder *)ref,puVar22,
                           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)local_e8);
            puVar22 = puVar22 + 1;
          } while (puVar22 != puVar5);
        }
        pLVar20 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                                *)&local_98);
        local_a0._M_head_impl = (LogicalOperator *)local_e8;
        local_e8 = (undefined1  [8])0x0;
        LogicalOperator::AddChild
                  (&pLVar20->super_LogicalOperator,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_a0);
        if (local_a0._M_head_impl != (LogicalOperator *)0x0) {
          (*(local_a0._M_head_impl)->_vptr_LogicalOperator[1])();
        }
        local_a0._M_head_impl = (LogicalOperator *)0x0;
        (((enable_shared_from_this<duckdb::Binder> *)&(local_c8._M_head_impl)->_vptr_LogicalOperator
         )->__weak_this_).internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_98._M_head_impl;
        auVar23 = local_e8;
        goto LAB_00711da9;
      }
    }
  }
  context._M_head_impl =
       (ref->super_BoundTableRef).sample.
       super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
       super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
       super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl;
  type = *(JoinType *)
          ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x60))->
                  _M_use_count + 1);
  local_60._M_head_impl = (LogicalOperator *)local_e0._16_8_;
  local_e0._16_8_ = (ClientContext *)0x0;
  local_70._M_next_resize = local_e0._0_8_;
  local_e0._0_8_ =
       (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
        )0x0;
  local_70._0_8_ =
       *(undefined8 *)
        &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x40))->_M_use_count;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x40))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x40))->_M_weak_count = 0;
  LogicalComparisonJoin::CreateJoin
            ((LogicalComparisonJoin *)local_c8._M_head_impl,(ClientContext *)context._M_head_impl,
             type,reftype,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_60,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_70._M_next_resize,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)
             &local_70);
  if ((long *)local_70._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_70._0_8_ + 8))();
  }
  local_70._M_max_load_factor = 0.0;
  local_70._4_4_ = 0;
  if ((element_type *)local_70._M_next_resize != (element_type *)0x0) {
    (**(code **)(*(long *)&(((enable_shared_from_this<duckdb::Binder> *)local_70._M_next_resize)->
                           __weak_this_).internal.
                           super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2> + 8))();
  }
  local_70._M_next_resize = 0;
  if ((element_type *)local_60._M_head_impl != (element_type *)0x0) {
    (**(code **)((long)(((enable_shared_from_this<duckdb::Binder> *)
                        &(local_60._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                       super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8))();
  }
  local_60._M_head_impl = (LogicalOperator *)0x0;
  local_e8 = (undefined1  [8])0x0;
  pLVar15 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)local_c8._M_head_impl);
  _Var16._M_head_impl = local_c8._M_head_impl;
  if (pLVar15->type == LOGICAL_FILTER) {
    pLVar15 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)local_c8._M_head_impl);
    _Var16._M_head_impl =
         (LogicalOperator *)
         vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
         ::operator[](&pLVar15->children,0);
  }
  local_e8 = (undefined1  [8])
             (((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                *)&(((Binder *)_Var16._M_head_impl)->super_enable_shared_from_this<duckdb::Binder>).
                   __weak_this_.internal.
                   super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>)._M_head_impl;
  if (*(char *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x60))->
                       _M_use_count + 1) == '\a') {
    pp_Var3 = *(_func_int ***)
               &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x80))->
                _M_use_count;
    optional_ptr<duckdb::LogicalOperator,_true>::CheckValid
              ((optional_ptr<duckdb::LogicalOperator,_true> *)local_e8);
    ((LogicalOperator *)((long)local_e8 + 0x68))->_vptr_LogicalOperator = pp_Var3;
  }
  optional_ptr<duckdb::LogicalOperator,_true>::CheckValid
            ((optional_ptr<duckdb::LogicalOperator,_true> *)local_e8);
  puVar4 = (((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              *)((long)local_e8 + 0x10))->
           super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_05 = (((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                    *)((long)local_e8 + 0x10))->
                 super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_05 != puVar4; this_05 = this_05 + 1
      ) {
    pLVar15 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->(this_05);
    if (pLVar15->type == LOGICAL_FILTER) {
      pLVar15 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->(this_05);
      pLVar17 = LogicalOperator::Cast<duckdb::LogicalFilter>(pLVar15);
      puVar22 = (pLVar17->super_LogicalOperator).expressions.
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar5 = (pLVar17->super_LogicalOperator).expressions.
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar22 != puVar5) {
        do {
          pvVar18 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                    ::operator[](&(pLVar17->super_LogicalOperator).children,0);
          PlanSubqueries((Binder *)ref,puVar22,pvVar18);
          puVar22 = puVar22 + 1;
        } while (puVar22 != puVar5);
      }
    }
  }
  optional_ptr<duckdb::LogicalOperator,_true>::CheckValid
            ((optional_ptr<duckdb::LogicalOperator,_true> *)local_e8);
  LVar2 = *(LogicalOperatorType *)((long)local_e8 + 8);
  if (LVar2 == LOGICAL_ASOF_JOIN) {
LAB_007120a1:
    optional_ptr<duckdb::LogicalOperator,_true>::CheckValid
              ((optional_ptr<duckdb::LogicalOperator,_true> *)local_e8);
    auVar23 = local_e8;
    if ((pointer)((LogicalOperator *)((long)local_e8 + 0x68))->estimated_cardinality !=
        (((LogicalOperator *)((long)local_e8 + 0x68))->types).
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      this_02 = &(((LogicalOperator *)((long)local_e8 + 0x68))->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      this_01 = (vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                 *)((long)local_e8 + 0x10);
      __n = 0;
      do {
        pvVar19 = vector<duckdb::JoinCondition,_true>::operator[]
                            ((vector<duckdb::JoinCondition,_true> *)this_02,__n);
        pvVar18 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                  ::operator[](this_01,0);
        PlanSubqueries((Binder *)ref,&pvVar19->left,pvVar18);
        pvVar19 = vector<duckdb::JoinCondition,_true>::operator[]
                            ((vector<duckdb::JoinCondition,_true> *)this_02,__n);
        pvVar18 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                  ::operator[](this_01,1);
        PlanSubqueries((Binder *)ref,&pvVar19->right,pvVar18);
        __n = __n + 1;
      } while (__n < (ulong)(((long)(((LogicalOperator *)((long)auVar23 + 0x68))->
                                     estimated_cardinality -
                                    (long)(((LogicalOperator *)((long)auVar23 + 0x68))->types).
                                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                          .
                                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage) >> 3)
                            * -0x5555555555555555));
    }
  }
  else if (LVar2 == LOGICAL_ANY_JOIN) {
    optional_ptr<duckdb::LogicalOperator,_true>::CheckValid
              ((optional_ptr<duckdb::LogicalOperator,_true> *)local_e8);
    pLVar21 = LogicalOperator::Cast<duckdb::LogicalAnyJoin>((LogicalOperator *)local_e8);
    pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(&pLVar21->condition);
    iVar11 = (*(pEVar14->super_BaseExpression)._vptr_BaseExpression[4])(pEVar14);
    if ((char)iVar11 != '\0') {
      this_04 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_c0._0_8_ = local_c0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,"Cannot perform non-inner join on subquery!","");
      NotImplementedException::NotImplementedException(this_04,(string *)local_c0);
      __cxa_throw(this_04,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else if (LVar2 == LOGICAL_COMPARISON_JOIN) goto LAB_007120a1;
  if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x50))->
      _vptr__Sp_counted_base !=
      *(_func_int ***)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x50))->_M_use_count) {
    optional_ptr<duckdb::LogicalOperator,_true>::CheckValid
              ((optional_ptr<duckdb::LogicalOperator,_true> *)local_e8);
    *(LogicalOperatorType *)((long)local_e8 + 8) = LOGICAL_DELIM_JOIN;
    *(char *)&(((LogicalOperator *)((long)local_e8 + 0xd0))->expressions).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
         (char)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x60))->
               _M_use_count;
    this_06 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x50))->
              _vptr__Sp_counted_base;
    puVar6 = *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)
              &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e0._8_8_ + 0x50))->
               _M_use_count;
    if (this_06 != puVar6) {
      pLVar8 = (LogicalOperator *)((long)local_e8 + 0xd0);
      do {
        pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(this_06);
        (*(pEVar14->super_BaseExpression)._vptr_BaseExpression[0x11])
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_c0,pEVar14);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&(pLVar8->children).
                       super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_c0);
        if ((_func_int **)local_c0._0_8_ != (_func_int **)0x0) {
          (**(code **)(*(_func_int **)local_c0._0_8_ + 8))();
        }
        this_06 = this_06 + 1;
      } while (this_06 != puVar6);
    }
  }
LAB_00712364:
  if ((LogicalOperator *)local_e0._0_8_ != (LogicalOperator *)0x0) {
    (**(code **)(*(long *)local_e0._0_8_ + 8))();
  }
  if ((ClientContext *)local_e0._16_8_ != (ClientContext *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_e0._16_8_)->__weak_this_).
                internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         )local_c8._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> Binder::CreatePlan(BoundJoinRef &ref) {
	auto old_is_outside_flattened = is_outside_flattened;
	// Plan laterals from outermost to innermost
	if (ref.lateral) {
		// Set the flag to ensure that children do not flatten before the root
		is_outside_flattened = false;
	}
	auto left = CreatePlan(*ref.left);
	auto right = CreatePlan(*ref.right);
	is_outside_flattened = old_is_outside_flattened;

	// For joins, depth of the bindings will be one higher on the right because of the lateral binder
	// If the current join does not have correlations between left and right, then the right bindings
	// have depth 1 too high and can be reduced by 1 throughout
	if (!ref.lateral && !ref.correlated_columns.empty()) {
		LateralBinder::ReduceExpressionDepth(*right, ref.correlated_columns);
	}

	if (ref.type == JoinType::RIGHT && ref.ref_type != JoinRefType::ASOF &&
	    ClientConfig::GetConfig(context).enable_optimizer &&
	    !Optimizer::OptimizerDisabled(context, OptimizerType::BUILD_SIDE_PROBE_SIDE)) {
		// we turn any right outer joins into left outer joins for optimization purposes
		// they are the same but with sides flipped, so treating them the same simplifies life
		ref.type = JoinType::LEFT;
		std::swap(left, right);
	}
	if (ref.lateral) {
		auto new_plan = PlanLateralJoin(std::move(left), std::move(right), ref.correlated_columns, ref.type,
		                                std::move(ref.condition));
		if (has_unplanned_dependent_joins) {
			RecursiveDependentJoinPlanner plan(*this);
			plan.VisitOperator(*new_plan);
		}
		return new_plan;
	}
	switch (ref.ref_type) {
	case JoinRefType::CROSS:
		return LogicalCrossProduct::Create(std::move(left), std::move(right));
	case JoinRefType::POSITIONAL:
		return LogicalPositionalJoin::Create(std::move(left), std::move(right));
	default:
		break;
	}
	if (ref.type == JoinType::INNER && (ref.condition->HasSubquery() || HasCorrelatedColumns(*ref.condition)) &&
	    ref.ref_type == JoinRefType::REGULAR) {
		// inner join, generate a cross product + filter
		// this will be later turned into a proper join by the join order optimizer
		auto root = LogicalCrossProduct::Create(std::move(left), std::move(right));

		auto filter = make_uniq<LogicalFilter>(std::move(ref.condition));
		// visit the expressions in the filter
		for (auto &expression : filter->expressions) {
			PlanSubqueries(expression, root);
		}
		filter->AddChild(std::move(root));
		return std::move(filter);
	}

	// now create the join operator from the join condition
	auto result = LogicalComparisonJoin::CreateJoin(context, ref.type, ref.ref_type, std::move(left), std::move(right),
	                                                std::move(ref.condition));
	optional_ptr<LogicalOperator> join;
	if (result->type == LogicalOperatorType::LOGICAL_FILTER) {
		join = result->children[0].get();
	} else {
		join = result.get();
	}

	if (ref.type == JoinType::MARK) {
		join->Cast<LogicalJoin>().mark_index = ref.mark_index;
	}
	for (auto &child : join->children) {
		if (child->type == LogicalOperatorType::LOGICAL_FILTER) {
			auto &filter = child->Cast<LogicalFilter>();
			for (auto &expr : filter.expressions) {
				PlanSubqueries(expr, filter.children[0]);
			}
		}
	}

	// we visit the expressions depending on the type of join
	switch (join->type) {
	case LogicalOperatorType::LOGICAL_ASOF_JOIN:
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN: {
		// comparison join
		// in this join we visit the expressions on the LHS with the LHS as root node
		// and the expressions on the RHS with the RHS as root node
		auto &comp_join = join->Cast<LogicalComparisonJoin>();
		for (idx_t i = 0; i < comp_join.conditions.size(); i++) {
			PlanSubqueries(comp_join.conditions[i].left, comp_join.children[0]);
			PlanSubqueries(comp_join.conditions[i].right, comp_join.children[1]);
		}
		break;
	}
	case LogicalOperatorType::LOGICAL_ANY_JOIN: {
		auto &any_join = join->Cast<LogicalAnyJoin>();
		// for the any join we just visit the condition
		if (any_join.condition->HasSubquery()) {
			throw NotImplementedException("Cannot perform non-inner join on subquery!");
		}
		break;
	}
	default:
		break;
	}
	if (!ref.duplicate_eliminated_columns.empty()) {
		auto &comp_join = join->Cast<LogicalComparisonJoin>();
		comp_join.type = LogicalOperatorType::LOGICAL_DELIM_JOIN;
		comp_join.delim_flipped = ref.delim_flipped;
		for (auto &col : ref.duplicate_eliminated_columns) {
			comp_join.duplicate_eliminated_columns.emplace_back(col->Copy());
		}
	}
	return result;
}